

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_witness_stack_init_alloc(size_t allocation_len,wally_tx_witness_stack **output)

{
  wally_tx_witness_stack *pwVar1;
  wally_tx_witness_item *pwVar2;
  wally_tx_witness_stack *result;
  wally_tx_witness_stack **output_local;
  size_t allocation_len_local;
  
  if (output == (wally_tx_witness_stack **)0x0) {
    allocation_len_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx_witness_stack *)0x0;
    pwVar1 = (wally_tx_witness_stack *)wally_calloc(0x18);
    *output = pwVar1;
    if (*output == (wally_tx_witness_stack *)0x0) {
      allocation_len_local._4_4_ = -3;
    }
    else {
      pwVar1 = *output;
      if (allocation_len != 0) {
        pwVar2 = (wally_tx_witness_item *)wally_calloc(allocation_len << 4);
        pwVar1->items = pwVar2;
        if (pwVar1->items == (wally_tx_witness_item *)0x0) {
          wally_free(pwVar1);
          *output = (wally_tx_witness_stack *)0x0;
          return -3;
        }
      }
      pwVar1->items_allocation_len = allocation_len;
      pwVar1->num_items = 0;
      allocation_len_local._4_4_ = 0;
    }
  }
  return allocation_len_local._4_4_;
}

Assistant:

int wally_tx_witness_stack_init_alloc(size_t allocation_len,
                                      struct wally_tx_witness_stack **output)
{
    struct wally_tx_witness_stack *result;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_witness_stack);

    if (allocation_len) {
        result->items = wally_calloc(allocation_len * sizeof(*result->items));
        if (!result->items) {
            wally_free(result);
            *output = NULL;
            return WALLY_ENOMEM;
        }
    }
    result->items_allocation_len = allocation_len;
    result->num_items = 0;
    return WALLY_OK;
}